

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetPHINFPortLocation(ndicapi *pol,char *location)

{
  int i;
  long lVar1;
  
  lVar1 = 0;
  do {
    location[lVar1] = pol->PhinfPortLocation[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xe);
  return pol->PhinfUnoccupied;
}

Assistant:

ndicapiExport int ndiGetPHINFPortLocation(ndicapi* pol, char location[14])
{
  char* dp;
  int i;

  dp = pol->PhinfPortLocation;

  for (i = 0; i < 14; i++)
  {
    location[i] = *dp++;
  }

  return pol->PhinfUnoccupied;
}